

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample.cpp
# Opt level: O1

vector<Point_d,_std::allocator<Point_d>_> * __thiscall
Sampler::sample_rand_points
          (vector<Point_d,_std::allocator<Point_d>_> *__return_storage_ptr__,Sampler *this)

{
  iterator __position;
  undefined8 this_00;
  long lVar1;
  int iVar2;
  int iVar3;
  undefined1 auStack_70 [8];
  Point_d pix;
  void *pvStack_48;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> not_sampled_yet;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"sampling random points\n",0x17);
  (__return_storage_ptr__->super__Vector_base<Point_d,_std::allocator<Point_d>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Point_d,_std::allocator<Point_d>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar3 = 0;
  (__return_storage_ptr__->super__Vector_base<Point_d,_std::allocator<Point_d>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  not_sampled_yet.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pvStack_48 = (void *)0x0;
  not_sampled_yet.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pix._24_8_ = __return_storage_ptr__;
  if (0 < this->_X) {
    do {
      if (0 < this->_Y) {
        iVar2 = 0;
        do {
          auStack_70._4_4_ = iVar2;
          auStack_70._0_4_ = iVar3;
          if (not_sampled_yet.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start ==
              not_sampled_yet.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_finish) {
            std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
            _M_realloc_insert<std::pair<int,int>>
                      ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&pvStack_48,
                       (iterator)
                       not_sampled_yet.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,(pair<int,_int> *)auStack_70);
          }
          else {
            (not_sampled_yet.
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start)->first = iVar3;
            (not_sampled_yet.
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start)->second = iVar2;
            not_sampled_yet.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start =
                 not_sampled_yet.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start + 1;
          }
          iVar2 = iVar2 + 1;
        } while (iVar2 < this->_Y);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < this->_X);
  }
  Point_d::Point_d((Point_d *)auStack_70,999999.0,99999.0,99999.0,9999999);
  this_00 = pix._24_8_;
  if (0 < this->_Amount) {
    iVar3 = 0;
    do {
      iVar2 = rand();
      lVar1 = (long)(int)((ulong)(long)iVar2 %
                         (ulong)((long)not_sampled_yet.
                                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start - (long)pvStack_48
                                >> 3));
      auStack_70 = (undefined1  [8])(double)*(int *)((long)pvStack_48 + lVar1 * 8);
      pix.x = (double)*(int *)((long)pvStack_48 + lVar1 * 8 + 4);
      *(int *)((long)pvStack_48 + lVar1 * 8) =
           not_sampled_yet.
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start[-1].first;
      *(int *)((long)pvStack_48 + lVar1 * 8 + 4) =
           not_sampled_yet.
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start[-1].second;
      __position._M_current = *(Point_d **)(this_00 + 8);
      pix.dis._0_4_ = iVar3;
      if (__position._M_current == *(Point_d **)(this_00 + 0x10)) {
        not_sampled_yet.
        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_start =
             not_sampled_yet.
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start + -1;
        std::vector<Point_d,std::allocator<Point_d>>::_M_realloc_insert<Point_d_const&>
                  ((vector<Point_d,std::allocator<Point_d>> *)this_00,__position,
                   (Point_d *)auStack_70);
      }
      else {
        (__position._M_current)->dis = pix.y;
        *(ulong *)&(__position._M_current)->id = CONCAT44(pix.dis._4_4_,iVar3);
        (__position._M_current)->x = (double)auStack_70;
        (__position._M_current)->y = pix.x;
        *(Point_d **)(this_00 + 8) = __position._M_current + 1;
        not_sampled_yet.
        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_start =
             not_sampled_yet.
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start + -1;
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < this->_Amount);
  }
  if (pvStack_48 != (void *)0x0) {
    operator_delete(pvStack_48,
                    (long)not_sampled_yet.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pvStack_48);
  }
  return (vector<Point_d,_std::allocator<Point_d>_> *)this_00;
}

Assistant:

std::vector<Point_d> sample_rand_points(){
      std::cout<<"sampling random points\n";
      std::vector<Point_d> output_pattern;

      //PREPARE:
      std::vector<std::pair<int, int> > not_sampled_yet;
      for(int x=0; x<_X; x++)
      {
        for(int y=0; y<_Y; y++)
        {
          not_sampled_yet.push_back(std::pair<int,int>(x,y));
        }
      }
      //SAMPLING
      Point_d pix;
      for (int i=0; i<_Amount; i++)
      {
        //std::cout<<i<<"\n";
        int n= rand()% not_sampled_yet.size();
        pix.x= (double)not_sampled_yet[n].first;
        pix.y= (double)not_sampled_yet[n].second;
        pix.id = i;
        not_sampled_yet[n]=not_sampled_yet.back();
        not_sampled_yet.pop_back();
        output_pattern.push_back(pix);
      }
      return output_pattern;

    }